

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void computeSOffset(vector<char,_std::allocator<char>_> *cigar,int *c,int *q)

{
  bool bVar1;
  const_iterator __lhs;
  int *in_RDX;
  int *in_RSI;
  char *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28 [2];
  int *local_18;
  int *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28[0]._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffffc8);
  __lhs = std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffffc8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )__lhs._M_current,
                       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return;
    }
    in_stack_ffffffffffffffc8 =
         (vector<char,_std::allocator<char>_> *)
         __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
         operator*(local_28);
    if ((in_stack_ffffffffffffffc8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Tp_alloc_type == (_Tp_alloc_type)0x53) {
      *local_10 = *local_10 + 1;
      *local_18 = *local_18 + 1;
    }
    else {
      if ((in_stack_ffffffffffffffc8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Tp_alloc_type != (_Tp_alloc_type)0x48) {
        return;
      }
      *local_10 = *local_10 + 1;
    }
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(local_28);
  } while( true );
}

Assistant:

void computeSOffset(const std::vector<char>& cigar,int& c, int& q){
    for(auto& i : cigar){
        if (i == 'S'){
            c++;
            q++;
        } else if(i == 'H'){

            c++;
        } else break;
    }
}